

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int *__s;
  int *piVar16;
  unsigned_short *__ptr;
  int *__s_00;
  uchar *puVar17;
  uint *puVar18;
  undefined1 (*frequencies) [16];
  undefined1 (*frequencies_00) [16];
  uint *puVar19;
  void *__dest;
  void *__ptr_00;
  ulong uVar20;
  unsigned_short uVar21;
  ulong uVar22;
  size_t sVar23;
  int iVar24;
  ulong uVar25;
  size_t sVar26;
  long lVar27;
  uint *puVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  size_t sVar32;
  long lVar33;
  ulong uVar34;
  size_t __size;
  ulong uVar35;
  ulong uVar36;
  size_t sVar37;
  long lVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar75;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int iVar83;
  int iVar85;
  int iVar86;
  undefined1 auVar84 [16];
  int iVar87;
  long local_210;
  LodePNGBitWriter local_190;
  ucvector v;
  HuffmanTree tree_ll;
  undefined1 local_108 [16];
  size_t local_f8;
  unsigned_short *local_e8;
  int *local_e0;
  int *local_d8;
  unsigned_short *local_d0;
  HuffmanTree tree_d;
  undefined1 local_98 [40];
  ulong local_70;
  ulong local_68;
  Hash hash;
  
  v.data = *out;
  v.size = *outsize;
  local_190.data = &v;
  local_190.bp = '\0';
  uVar14 = settings->btype;
  uVar13 = 0x3d;
  if (uVar14 < 3) {
    sVar32 = insize;
    v.allocsize = v.size;
    if (uVar14 != 1) {
      if (uVar14 == 0) {
        if (insize + 0xfffe < 0xffff) {
          uVar13 = 0;
        }
        else {
          uVar36 = (insize + 0xfffe) / 0xffff;
          lVar38 = 0;
          do {
            sVar32 = v.size;
            sVar26 = (size_t)(uint)((int)insize - (int)lVar38);
            if (0xfffe < insize - lVar38) {
              sVar26 = 0xffff;
            }
            v.size = sVar26 + v.size + 5;
            puVar17 = v.data;
            if (v.allocsize < v.size) {
              __size = v.size + (v.allocsize >> 1);
              puVar17 = (uchar *)realloc(v.data,__size);
              v.allocsize = __size;
              if (puVar17 == (uchar *)0x0) {
                uVar13 = 0x53;
                goto LAB_001def22;
              }
            }
            v.data = puVar17;
            iVar24 = 0xffff - (int)sVar26;
            v.data[sVar32] = uVar36 == 1;
            v.data[sVar32 + 1] = (uchar)sVar26;
            v.data[sVar32 + 2] = (uchar)(sVar26 >> 8);
            v.data[sVar32 + 3] = (uchar)iVar24;
            v.data[sVar32 + 4] = (uchar)((uint)iVar24 >> 8);
            if (sVar26 != 0) {
              memcpy(v.data + sVar32 + 5,in + lVar38,sVar26);
            }
            lVar38 = lVar38 + sVar26;
            uVar36 = uVar36 - 1;
          } while (uVar36 != 0);
          uVar13 = 0;
        }
        goto LAB_001def22;
      }
      uVar36 = 0xfff8;
      if (0xfff8 < insize >> 3) {
        uVar36 = insize >> 3;
      }
      if (0x3fff7 < uVar36) {
        uVar36 = 0x3fff8;
      }
      sVar32 = uVar36 + 8;
    }
    uVar36 = 1;
    if (!CARRY8(insize - 1,sVar32)) {
      uVar36 = ((insize - 1) + sVar32) / sVar32;
    }
    uVar34 = (ulong)settings->windowsize;
    __s = (int *)malloc(0x40000);
    hash.head = __s;
    piVar16 = (int *)malloc(uVar34 * 4);
    sVar26 = uVar34 * 2;
    hash.val = piVar16;
    __ptr = (unsigned_short *)malloc(sVar26);
    hash.chain = __ptr;
    local_d0 = (unsigned_short *)malloc(sVar26);
    hash.zeros = local_d0;
    __s_00 = (int *)malloc(0x40c);
    hash.headz = __s_00;
    local_e8 = (unsigned_short *)malloc(sVar26);
    uVar13 = 0x53;
    local_e0 = piVar16;
    local_d8 = __s;
    hash.chainz = local_e8;
    if (((((piVar16 != (int *)0x0) && (__s != (int *)0x0)) && (__ptr != (unsigned_short *)0x0)) &&
        ((local_d0 != (unsigned_short *)0x0 && (__s_00 != (int *)0x0)))) &&
       (local_e8 != (unsigned_short *)0x0)) {
      memset(__s,0xff,0x40000);
      if (uVar34 == 0) {
        memset(__s_00,0xff,0x40c);
      }
      else {
        memset(local_e0,0xff,uVar34 * 4);
        auVar9 = _DAT_001fb370;
        lVar38 = uVar34 - 1;
        auVar84._8_4_ = (int)lVar38;
        auVar84._0_8_ = lVar38;
        auVar84._12_4_ = (int)((ulong)lVar38 >> 0x20);
        uVar22 = 0;
        auVar84 = auVar84 ^ _DAT_001fb370;
        auVar53 = _DAT_001fb560;
        auVar78 = _DAT_001fb570;
        auVar82 = _DAT_001fb580;
        auVar57 = _DAT_001fb590;
        do {
          auVar44 = auVar57 ^ auVar9;
          iVar83 = auVar84._0_4_;
          iVar24 = -(uint)(iVar83 < auVar44._0_4_);
          iVar85 = auVar84._4_4_;
          auVar45._4_4_ = -(uint)(iVar85 < auVar44._4_4_);
          iVar86 = auVar84._8_4_;
          iVar75 = -(uint)(iVar86 < auVar44._8_4_);
          iVar87 = auVar84._12_4_;
          auVar45._12_4_ = -(uint)(iVar87 < auVar44._12_4_);
          auVar64._4_4_ = iVar24;
          auVar64._0_4_ = iVar24;
          auVar64._8_4_ = iVar75;
          auVar64._12_4_ = iVar75;
          auVar76 = pshuflw(in_XMM8,auVar64,0xe8);
          auVar47._4_4_ = -(uint)(auVar44._4_4_ == iVar85);
          auVar47._12_4_ = -(uint)(auVar44._12_4_ == iVar87);
          auVar47._0_4_ = auVar47._4_4_;
          auVar47._8_4_ = auVar47._12_4_;
          auVar81 = pshuflw(in_XMM9,auVar47,0xe8);
          auVar45._0_4_ = auVar45._4_4_;
          auVar45._8_4_ = auVar45._12_4_;
          auVar77 = pshuflw(auVar76,auVar45,0xe8);
          auVar44._8_4_ = 0xffffffff;
          auVar44._0_8_ = 0xffffffffffffffff;
          auVar44._12_4_ = 0xffffffff;
          auVar44 = (auVar77 | auVar81 & auVar76) ^ auVar44;
          auVar44 = packssdw(auVar44,auVar44);
          uVar21 = (unsigned_short)uVar22;
          if ((auVar44 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            __ptr[uVar22] = uVar21;
          }
          auVar45 = auVar47 & auVar64 | auVar45;
          auVar44 = packssdw(auVar45,auVar45);
          auVar77._8_4_ = 0xffffffff;
          auVar77._0_8_ = 0xffffffffffffffff;
          auVar77._12_4_ = 0xffffffff;
          auVar44 = packssdw(auVar44 ^ auVar77,auVar44 ^ auVar77);
          if ((auVar44._0_4_ >> 0x10 & 1) != 0) {
            __ptr[uVar22 + 1] = uVar21 + 1;
          }
          auVar44 = auVar82 ^ auVar9;
          iVar24 = -(uint)(iVar83 < auVar44._0_4_);
          auVar71._4_4_ = -(uint)(iVar85 < auVar44._4_4_);
          iVar75 = -(uint)(iVar86 < auVar44._8_4_);
          auVar71._12_4_ = -(uint)(iVar87 < auVar44._12_4_);
          auVar46._4_4_ = iVar24;
          auVar46._0_4_ = iVar24;
          auVar46._8_4_ = iVar75;
          auVar46._12_4_ = iVar75;
          auVar63._4_4_ = -(uint)(auVar44._4_4_ == iVar85);
          auVar63._12_4_ = -(uint)(auVar44._12_4_ == iVar87);
          auVar63._0_4_ = auVar63._4_4_;
          auVar63._8_4_ = auVar63._12_4_;
          auVar71._0_4_ = auVar71._4_4_;
          auVar71._8_4_ = auVar71._12_4_;
          auVar44 = auVar63 & auVar46 | auVar71;
          auVar44 = packssdw(auVar44,auVar44);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar44 = packssdw(auVar44 ^ auVar2,auVar44 ^ auVar2);
          if ((auVar44 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            __ptr[uVar22 + 2] = uVar21 + 2;
          }
          auVar47 = pshufhw(auVar46,auVar46,0x84);
          auVar64 = pshufhw(auVar63,auVar63,0x84);
          auVar45 = pshufhw(auVar47,auVar71,0x84);
          auVar48._8_4_ = 0xffffffff;
          auVar48._0_8_ = 0xffffffffffffffff;
          auVar48._12_4_ = 0xffffffff;
          auVar48 = (auVar45 | auVar64 & auVar47) ^ auVar48;
          auVar47 = packssdw(auVar48,auVar48);
          if ((auVar47 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            __ptr[uVar22 + 3] = uVar21 + 3;
          }
          auVar47 = auVar78 ^ auVar9;
          iVar24 = -(uint)(iVar83 < auVar47._0_4_);
          auVar50._4_4_ = -(uint)(iVar85 < auVar47._4_4_);
          iVar75 = -(uint)(iVar86 < auVar47._8_4_);
          auVar50._12_4_ = -(uint)(iVar87 < auVar47._12_4_);
          auVar65._4_4_ = iVar24;
          auVar65._0_4_ = iVar24;
          auVar65._8_4_ = iVar75;
          auVar65._12_4_ = iVar75;
          auVar44 = pshuflw(auVar44,auVar65,0xe8);
          auVar49._4_4_ = -(uint)(auVar47._4_4_ == iVar85);
          auVar49._12_4_ = -(uint)(auVar47._12_4_ == iVar87);
          auVar49._0_4_ = auVar49._4_4_;
          auVar49._8_4_ = auVar49._12_4_;
          in_XMM9 = pshuflw(auVar81 & auVar76,auVar49,0xe8);
          in_XMM9 = in_XMM9 & auVar44;
          auVar50._0_4_ = auVar50._4_4_;
          auVar50._8_4_ = auVar50._12_4_;
          auVar44 = pshuflw(auVar44,auVar50,0xe8);
          auVar76._8_4_ = 0xffffffff;
          auVar76._0_8_ = 0xffffffffffffffff;
          auVar76._12_4_ = 0xffffffff;
          auVar76 = (auVar44 | in_XMM9) ^ auVar76;
          auVar44 = packssdw(auVar76,auVar76);
          if ((auVar44 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            __ptr[uVar22 + 4] = uVar21 + 4;
          }
          auVar50 = auVar49 & auVar65 | auVar50;
          auVar44 = packssdw(auVar50,auVar50);
          auVar81._8_4_ = 0xffffffff;
          auVar81._0_8_ = 0xffffffffffffffff;
          auVar81._12_4_ = 0xffffffff;
          auVar44 = packssdw(auVar44 ^ auVar81,auVar44 ^ auVar81);
          if ((auVar44 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            __ptr[uVar22 + 5] = uVar21 + 5;
          }
          auVar44 = auVar53 ^ auVar9;
          iVar24 = -(uint)(iVar83 < auVar44._0_4_);
          auVar72._4_4_ = -(uint)(iVar85 < auVar44._4_4_);
          iVar75 = -(uint)(iVar86 < auVar44._8_4_);
          auVar72._12_4_ = -(uint)(iVar87 < auVar44._12_4_);
          auVar51._4_4_ = iVar24;
          auVar51._0_4_ = iVar24;
          auVar51._8_4_ = iVar75;
          auVar51._12_4_ = iVar75;
          auVar66._4_4_ = -(uint)(auVar44._4_4_ == iVar85);
          auVar66._12_4_ = -(uint)(auVar44._12_4_ == iVar87);
          auVar66._0_4_ = auVar66._4_4_;
          auVar66._8_4_ = auVar66._12_4_;
          auVar72._0_4_ = auVar72._4_4_;
          auVar72._8_4_ = auVar72._12_4_;
          auVar44 = auVar66 & auVar51 | auVar72;
          auVar44 = packssdw(auVar44,auVar44);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          in_XMM8 = packssdw(auVar44 ^ auVar3,auVar44 ^ auVar3);
          if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            __ptr[uVar22 + 6] = uVar21 + 6;
          }
          auVar44 = pshufhw(auVar51,auVar51,0x84);
          auVar45 = pshufhw(auVar66,auVar66,0x84);
          auVar47 = pshufhw(auVar44,auVar72,0x84);
          auVar52._8_4_ = 0xffffffff;
          auVar52._0_8_ = 0xffffffffffffffff;
          auVar52._12_4_ = 0xffffffff;
          auVar52 = (auVar47 | auVar45 & auVar44) ^ auVar52;
          auVar44 = packssdw(auVar52,auVar52);
          if ((auVar44 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            __ptr[uVar22 + 7] = uVar21 + 7;
          }
          uVar22 = uVar22 + 8;
          lVar38 = auVar57._8_8_;
          auVar57._0_8_ = auVar57._0_8_ + 8;
          auVar57._8_8_ = lVar38 + 8;
          lVar38 = auVar82._8_8_;
          auVar82._0_8_ = auVar82._0_8_ + 8;
          auVar82._8_8_ = lVar38 + 8;
          lVar38 = auVar78._8_8_;
          auVar78._0_8_ = auVar78._0_8_ + 8;
          auVar78._8_8_ = lVar38 + 8;
          lVar38 = auVar53._8_8_;
          auVar53._0_8_ = auVar53._0_8_ + 8;
          auVar53._8_8_ = lVar38 + 8;
        } while ((uVar34 + 7 & 0xfffffffffffffff8) != uVar22);
        memset(__s_00,0xff,0x40c);
        auVar9 = _DAT_001fb370;
        uVar22 = 0;
        auVar40 = _DAT_001fb560;
        auVar41 = _DAT_001fb570;
        auVar42 = _DAT_001fb580;
        auVar43 = _DAT_001fb590;
        do {
          auVar53 = auVar43 ^ auVar9;
          iVar24 = -(uint)(iVar83 < auVar53._0_4_);
          auVar55._4_4_ = -(uint)(iVar85 < auVar53._4_4_);
          iVar75 = -(uint)(iVar86 < auVar53._8_4_);
          auVar55._12_4_ = -(uint)(iVar87 < auVar53._12_4_);
          auVar67._4_4_ = iVar24;
          auVar67._0_4_ = iVar24;
          auVar67._8_4_ = iVar75;
          auVar67._12_4_ = iVar75;
          auVar78 = pshuflw(in_XMM8,auVar67,0xe8);
          auVar54._4_4_ = -(uint)(auVar53._4_4_ == iVar85);
          auVar54._12_4_ = -(uint)(auVar53._12_4_ == iVar87);
          auVar54._0_4_ = auVar54._4_4_;
          auVar54._8_4_ = auVar54._12_4_;
          auVar82 = pshuflw(in_XMM9,auVar54,0xe8);
          auVar55._0_4_ = auVar55._4_4_;
          auVar55._8_4_ = auVar55._12_4_;
          auVar53 = pshuflw(auVar78,auVar55,0xe8);
          auVar79._8_4_ = 0xffffffff;
          auVar79._0_8_ = 0xffffffffffffffff;
          auVar79._12_4_ = 0xffffffff;
          auVar79 = (auVar53 | auVar82 & auVar78) ^ auVar79;
          auVar53 = packssdw(auVar79,auVar79);
          uVar21 = (unsigned_short)uVar22;
          if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_e8[uVar22] = uVar21;
          }
          auVar55 = auVar54 & auVar67 | auVar55;
          auVar53 = packssdw(auVar55,auVar55);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar53 = packssdw(auVar53 ^ auVar4,auVar53 ^ auVar4);
          if ((auVar53._0_4_ >> 0x10 & 1) != 0) {
            local_e8[uVar22 + 1] = uVar21 + 1;
          }
          auVar53 = auVar42 ^ auVar9;
          iVar24 = -(uint)(iVar83 < auVar53._0_4_);
          auVar73._4_4_ = -(uint)(iVar85 < auVar53._4_4_);
          iVar75 = -(uint)(iVar86 < auVar53._8_4_);
          auVar73._12_4_ = -(uint)(iVar87 < auVar53._12_4_);
          auVar56._4_4_ = iVar24;
          auVar56._0_4_ = iVar24;
          auVar56._8_4_ = iVar75;
          auVar56._12_4_ = iVar75;
          auVar68._4_4_ = -(uint)(auVar53._4_4_ == iVar85);
          auVar68._12_4_ = -(uint)(auVar53._12_4_ == iVar87);
          auVar68._0_4_ = auVar68._4_4_;
          auVar68._8_4_ = auVar68._12_4_;
          auVar73._0_4_ = auVar73._4_4_;
          auVar73._8_4_ = auVar73._12_4_;
          auVar53 = auVar68 & auVar56 | auVar73;
          auVar53 = packssdw(auVar53,auVar53);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar53 = packssdw(auVar53 ^ auVar5,auVar53 ^ auVar5);
          if ((auVar53 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_e8[uVar22 + 2] = uVar21 + 2;
          }
          auVar57 = pshufhw(auVar56,auVar56,0x84);
          auVar44 = pshufhw(auVar68,auVar68,0x84);
          auVar84 = pshufhw(auVar57,auVar73,0x84);
          auVar58._8_4_ = 0xffffffff;
          auVar58._0_8_ = 0xffffffffffffffff;
          auVar58._12_4_ = 0xffffffff;
          auVar58 = (auVar84 | auVar44 & auVar57) ^ auVar58;
          auVar57 = packssdw(auVar58,auVar58);
          if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_e8[uVar22 + 3] = uVar21 + 3;
          }
          auVar57 = auVar41 ^ auVar9;
          iVar24 = -(uint)(iVar83 < auVar57._0_4_);
          auVar60._4_4_ = -(uint)(iVar85 < auVar57._4_4_);
          iVar75 = -(uint)(iVar86 < auVar57._8_4_);
          auVar60._12_4_ = -(uint)(iVar87 < auVar57._12_4_);
          auVar69._4_4_ = iVar24;
          auVar69._0_4_ = iVar24;
          auVar69._8_4_ = iVar75;
          auVar69._12_4_ = iVar75;
          auVar53 = pshuflw(auVar53,auVar69,0xe8);
          auVar59._4_4_ = -(uint)(auVar57._4_4_ == iVar85);
          auVar59._12_4_ = -(uint)(auVar57._12_4_ == iVar87);
          auVar59._0_4_ = auVar59._4_4_;
          auVar59._8_4_ = auVar59._12_4_;
          in_XMM9 = pshuflw(auVar82 & auVar78,auVar59,0xe8);
          in_XMM9 = in_XMM9 & auVar53;
          auVar60._0_4_ = auVar60._4_4_;
          auVar60._8_4_ = auVar60._12_4_;
          auVar53 = pshuflw(auVar53,auVar60,0xe8);
          auVar80._8_4_ = 0xffffffff;
          auVar80._0_8_ = 0xffffffffffffffff;
          auVar80._12_4_ = 0xffffffff;
          auVar80 = (auVar53 | in_XMM9) ^ auVar80;
          auVar53 = packssdw(auVar80,auVar80);
          if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_e8[uVar22 + 4] = uVar21 + 4;
          }
          auVar60 = auVar59 & auVar69 | auVar60;
          auVar53 = packssdw(auVar60,auVar60);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar53 = packssdw(auVar53 ^ auVar6,auVar53 ^ auVar6);
          if ((auVar53 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            local_e8[uVar22 + 5] = uVar21 + 5;
          }
          auVar53 = auVar40 ^ auVar9;
          iVar24 = -(uint)(iVar83 < auVar53._0_4_);
          auVar74._4_4_ = -(uint)(iVar85 < auVar53._4_4_);
          iVar75 = -(uint)(iVar86 < auVar53._8_4_);
          auVar74._12_4_ = -(uint)(iVar87 < auVar53._12_4_);
          auVar61._4_4_ = iVar24;
          auVar61._0_4_ = iVar24;
          auVar61._8_4_ = iVar75;
          auVar61._12_4_ = iVar75;
          auVar70._4_4_ = -(uint)(auVar53._4_4_ == iVar85);
          auVar70._12_4_ = -(uint)(auVar53._12_4_ == iVar87);
          auVar70._0_4_ = auVar70._4_4_;
          auVar70._8_4_ = auVar70._12_4_;
          auVar74._0_4_ = auVar74._4_4_;
          auVar74._8_4_ = auVar74._12_4_;
          auVar53 = auVar70 & auVar61 | auVar74;
          auVar53 = packssdw(auVar53,auVar53);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          in_XMM8 = packssdw(auVar53 ^ auVar7,auVar53 ^ auVar7);
          if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_e8[uVar22 + 6] = uVar21 + 6;
          }
          auVar53 = pshufhw(auVar61,auVar61,0x84);
          auVar82 = pshufhw(auVar70,auVar70,0x84);
          auVar78 = pshufhw(auVar53,auVar74,0x84);
          auVar62._8_4_ = 0xffffffff;
          auVar62._0_8_ = 0xffffffffffffffff;
          auVar62._12_4_ = 0xffffffff;
          auVar62 = (auVar78 | auVar82 & auVar53) ^ auVar62;
          auVar53 = packssdw(auVar62,auVar62);
          if ((auVar53 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_e8[uVar22 + 7] = uVar21 + 7;
          }
          uVar22 = uVar22 + 8;
          lVar38 = auVar43._8_8_;
          auVar43._0_8_ = auVar43._0_8_ + 8;
          auVar43._8_8_ = lVar38 + 8;
          lVar38 = auVar42._8_8_;
          auVar42._0_8_ = auVar42._0_8_ + 8;
          auVar42._8_8_ = lVar38 + 8;
          lVar38 = auVar41._8_8_;
          auVar41._0_8_ = auVar41._0_8_ + 8;
          auVar41._8_8_ = lVar38 + 8;
          lVar38 = auVar40._8_8_;
          auVar40._0_8_ = auVar40._0_8_ + 8;
          auVar40._8_8_ = lVar38 + 8;
        } while ((uVar34 + 7 & 0x1fffffff8) != uVar22);
      }
      if (uVar36 == 0) {
        uVar13 = 0;
      }
      else {
        local_68 = uVar36 - 1;
        lVar38 = 0;
        uVar22 = 0;
        puVar17 = in;
        uVar34 = sVar32;
        do {
          uVar29 = uVar34;
          if (insize < uVar34) {
            uVar29 = insize;
          }
          bVar39 = uVar22 == local_68;
          uVar35 = uVar22 * sVar32;
          uVar20 = uVar35 + sVar32;
          if (insize <= uVar35 + sVar32) {
            uVar20 = insize;
          }
          if (settings->btype == 2) {
            local_108 = (undefined1  [16])0x0;
            local_f8 = 0;
            tree_ll.codes = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_ll.table_len = (uchar *)0x0;
            tree_ll.table_value = (unsigned_short *)0x0;
            tree_d.codes = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            tree_d.table_len = (uchar *)0x0;
            tree_d.table_value = (unsigned_short *)0x0;
            local_98._0_16_ = (undefined1  [16])0x0;
            local_98._24_16_ = (undefined1  [16])0x0;
            local_70 = uVar22;
            puVar18 = (uint *)malloc(0x478);
            frequencies = (undefined1 (*) [16])malloc(0x78);
            frequencies_00 = (undefined1 (*) [16])malloc(0x4c);
            if (frequencies_00 == (undefined1 (*) [16])0x0 ||
                (frequencies == (undefined1 (*) [16])0x0 || puVar18 == (uint *)0x0)) {
              uVar13 = 0x53;
              __dest = (void *)0x0;
              __ptr_00 = (void *)0x0;
            }
            else {
              uVar13 = 0x53;
              memset(puVar18,0,0x478);
              *frequencies = (undefined1  [16])0x0;
              frequencies[1] = (undefined1  [16])0x0;
              frequencies[2] = (undefined1  [16])0x0;
              frequencies[3] = (undefined1  [16])0x0;
              frequencies[4] = (undefined1  [16])0x0;
              frequencies[5] = (undefined1  [16])0x0;
              frequencies[6] = (undefined1  [16])0x0;
              *(undefined8 *)frequencies[7] = 0;
              *(undefined1 (*) [16])(frequencies_00[3] + 0xc) = (undefined1  [16])0x0;
              frequencies_00[3] = (undefined1  [16])0x0;
              frequencies_00[2] = (undefined1  [16])0x0;
              frequencies_00[1] = (undefined1  [16])0x0;
              *frequencies_00 = (undefined1  [16])0x0;
              if (settings->use_lz77 == 0) {
                sVar37 = uVar20 - uVar35;
                sVar26 = sVar37 * 4;
                if (sVar26 == 0) {
                  puVar19 = (uint *)0x0;
                  sVar26 = local_f8;
                  puVar28 = (uint *)local_108._0_8_;
                }
                else {
                  puVar19 = (uint *)malloc(sVar26);
                  puVar28 = puVar19;
                  uVar14 = uVar13;
                  if (puVar19 == (uint *)0x0) goto LAB_001de6d0;
                }
                local_108._0_8_ = puVar28;
                local_f8 = sVar26;
                local_108._8_8_ = sVar37;
                if (uVar35 < uVar20) {
                  lVar27 = 0;
                  do {
                    puVar19[lVar27] = (uint)puVar17[lVar27];
                    lVar27 = lVar27 + 1;
                  } while (uVar29 + lVar38 != lVar27);
                }
              }
              else {
                uVar14 = encodeLZ77((uivector *)local_108,&hash,in,uVar35,uVar20,
                                    settings->windowsize,settings->minmatch,settings->nicematch,
                                    settings->lazymatching);
                if (uVar14 != 0) {
LAB_001de6d0:
                  __ptr_00 = (void *)0x0;
                  __dest = (void *)0x0;
                  uVar13 = uVar14;
                  goto LAB_001dee15;
                }
                sVar37 = local_108._8_8_;
              }
              if (sVar37 != 0) {
                sVar23 = 0;
                do {
                  uVar14 = *(uint *)(local_108._0_8_ + sVar23 * 4);
                  puVar18[uVar14] = puVar18[uVar14] + 1;
                  if (0x100 < (ulong)uVar14) {
                    *(int *)(*frequencies + (ulong)*(uint *)(local_108._0_8_ + (sVar23 + 2) * 4) * 4
                            ) = *(int *)(*frequencies +
                                        (ulong)*(uint *)(local_108._0_8_ + (sVar23 + 2) * 4) * 4) +
                                1;
                    sVar23 = sVar23 + 3;
                  }
                  sVar23 = sVar23 + 1;
                } while (sVar23 != sVar37);
              }
              puVar18[0x100] = 1;
              uVar14 = HuffmanTree_makeFromFrequencies(&tree_ll,puVar18,0x101,0x11e,0xf);
              if (uVar14 == 0) {
                uVar15 = HuffmanTree_makeFromFrequencies(&tree_d,(uint *)frequencies,2,0x1e,0xf);
                uVar10 = tree_d.numcodes;
                uVar14 = tree_ll.numcodes;
                if (uVar15 == 0) {
                  uVar22 = 0x11e;
                  if (tree_ll.numcodes < 0x11e) {
                    uVar22 = (ulong)tree_ll.numcodes;
                  }
                  uVar29 = 0x1e;
                  if (tree_d.numcodes < 0x1e) {
                    uVar29 = (ulong)tree_d.numcodes;
                  }
                  uVar20 = uVar22 + uVar29;
                  uVar35 = (ulong)(uint)((int)uVar20 * 4);
                  __dest = malloc(uVar35);
                  __ptr_00 = malloc(uVar35);
                  if (__ptr_00 != (void *)0x0 && __dest != (void *)0x0) {
                    if (uVar14 != 0) {
                      memcpy(__dest,tree_ll.lengths,uVar22 * 4);
                    }
                    if (uVar10 != 0) {
                      memcpy((void *)((long)__dest + uVar22 * 4),tree_d.lengths,uVar29 * 4);
                    }
                    bVar8 = true;
                    if (uVar20 == 0) {
LAB_001dec11:
                      local_210 = 0;
                    }
                    else {
                      uVar35 = 0;
                      lVar27 = 0;
                      do {
                        uVar1 = uVar35 + 1;
                        iVar24 = *(int *)((long)__dest + uVar35 * 4);
                        if (uVar1 < uVar20) {
                          uVar25 = 0;
                          uVar31 = uVar1;
                          do {
                            if (*(int *)((long)__dest + uVar31 * 4) != iVar24) break;
                            uVar25 = (ulong)((int)uVar25 + 1);
                            uVar31 = uVar1 + uVar25;
                          } while (uVar31 < uVar20);
                          uVar14 = (uint)uVar25;
                          if (uVar14 < 2 || iVar24 != 0) {
                            if (uVar14 < 3) goto LAB_001deb37;
                            *(int *)((long)__ptr_00 + lVar27 * 4) = iVar24;
                            local_210 = lVar27 + 1;
                            if (5 < uVar14) {
                              lVar30 = (long)__ptr_00 + lVar27 * 4 + 8;
                              lVar33 = 0;
                              do {
                                *(undefined8 *)(lVar30 + -4) = 0x300000010;
                                lVar30 = lVar30 + 8;
                                lVar33 = lVar33 + -2;
                              } while ((ulong)(uint)((int)(uVar25 / 6) * 2) + lVar33 != 0);
                              local_210 = local_210 - lVar33;
                              lVar27 = lVar27 - lVar33;
                            }
                            uVar13 = uVar14 + (int)(uVar25 / 6) * -6;
                            if (uVar13 < 3) {
                              uVar14 = uVar14 - uVar13;
                            }
                            else {
                              *(undefined4 *)((long)__ptr_00 + local_210 * 4) = 0x10;
                              *(uint *)((long)__ptr_00 + lVar27 * 4 + 8) = uVar13 - 3;
                              local_210 = lVar27 + 3;
                            }
                          }
                          else {
                            uVar13 = uVar14 + 1;
                            if (uVar13 < 0xb) {
                              *(undefined4 *)((long)__ptr_00 + lVar27 * 4) = 0x11;
                              *(uint *)((long)__ptr_00 + lVar27 * 4 + 4) = uVar14 - 2;
                            }
                            else {
                              if (0x89 < uVar13) {
                                uVar13 = 0x8a;
                              }
                              *(undefined4 *)((long)__ptr_00 + lVar27 * 4) = 0x12;
                              *(uint *)((long)__ptr_00 + lVar27 * 4 + 4) = uVar13 - 0xb;
                              uVar14 = uVar13 - 1;
                            }
                            local_210 = lVar27 + 2;
                          }
                          uVar35 = uVar35 + uVar14;
                        }
                        else {
LAB_001deb37:
                          *(int *)((long)__ptr_00 + lVar27 * 4) = iVar24;
                          local_210 = lVar27 + 1;
                        }
                        uVar35 = uVar35 + 1;
                        lVar27 = local_210;
                      } while (uVar35 != uVar20);
                      if (local_210 == 0) goto LAB_001dec11;
                      lVar27 = 0;
                      do {
                        uVar20 = (ulong)*(uint *)((long)__ptr_00 + lVar27 * 4);
                        *(int *)(*frequencies_00 + uVar20 * 4) =
                             *(int *)(*frequencies_00 + uVar20 * 4) + 1;
                        lVar27 = (lVar27 - (ulong)(uVar20 < 0x10)) + 2;
                      } while (lVar27 != local_210);
                      bVar8 = false;
                    }
                    uVar13 = HuffmanTree_makeFromFrequencies
                                       ((HuffmanTree *)local_98,(uint *)frequencies_00,0x13,0x13,7);
                    if (uVar13 == 0) {
                      uVar12 = local_98._8_8_;
                      uVar20 = 0x14;
                      lVar27 = 0x13;
                      do {
                        lVar30 = lVar27;
                        uVar35 = uVar20 - 1;
                        if (uVar35 < 5) {
                          uVar35 = 4;
                          break;
                        }
                        lVar33 = uVar20 * 4;
                        uVar20 = uVar35;
                        lVar27 = lVar30 + -1;
                      } while (*(uint *)(local_98._8_8_ +
                                        (ulong)*(uint *)(&UNK_0021d808 + lVar33) * 4) == 0);
                      writeBits(&local_190,(uint)bVar39,1);
                      writeBits(&local_190,0,1);
                      writeBits(&local_190,1,1);
                      writeBits(&local_190,(int)uVar22 - 0x101,5);
                      writeBits(&local_190,(int)uVar29 - 1,5);
                      writeBits(&local_190,(int)uVar35 - 4,4);
                      puVar28 = CLCL_ORDER;
                      do {
                        writeBits(&local_190,*(uint *)(uVar12 + (ulong)*puVar28 * 4),3);
                        puVar28 = puVar28 + 1;
                        lVar30 = lVar30 + -1;
                      } while (lVar30 != 0);
                      if (!bVar8) {
                        uVar11 = local_98._0_8_;
                        lVar27 = 0;
                        do {
                          uVar14 = *(uint *)((long)__ptr_00 + lVar27 * 4);
                          writeBitsReversed(&local_190,*(uint *)(uVar11 + (ulong)uVar14 * 4),
                                            (ulong)*(uint *)(uVar12 + (ulong)uVar14 * 4));
                          if (uVar14 - 0x10 < 3) {
                            lVar30 = lVar27 * 4;
                            lVar27 = lVar27 + 1;
                            writeBits(&local_190,*(uint *)((long)__ptr_00 + lVar30 + 4),
                                      *(size_t *)(&DAT_0021d8e0 + (ulong)(uVar14 - 0x10) * 8));
                          }
                          lVar27 = lVar27 + 1;
                        } while (lVar27 != local_210);
                      }
                      writeLZ77data(&local_190,(uivector *)local_108,&tree_ll,&tree_d);
                      if ((ulong)tree_ll.lengths[0x100] == 0) {
                        uVar13 = 0x40;
                      }
                      else {
                        writeBitsReversed(&local_190,tree_ll.codes[0x100],
                                          (ulong)tree_ll.lengths[0x100]);
                        uVar13 = 0;
                      }
                    }
                  }
                }
                else {
                  __ptr_00 = (void *)0x0;
                  __dest = (void *)0x0;
                  uVar13 = uVar15;
                }
              }
              else {
                __ptr_00 = (void *)0x0;
                __dest = (void *)0x0;
                uVar13 = uVar14;
              }
            }
LAB_001dee15:
            free((void *)local_108._0_8_);
            HuffmanTree_cleanup(&tree_ll);
            HuffmanTree_cleanup(&tree_d);
            HuffmanTree_cleanup((HuffmanTree *)local_98);
            free(puVar18);
            free(frequencies);
            free(frequencies_00);
            free(__dest);
            free(__ptr_00);
            uVar22 = local_70;
          }
          else {
            uVar13 = 0;
            if (settings->btype == 1) {
              tree_ll.codes = (uint *)0x0;
              tree_ll.lengths = (uint *)0x0;
              tree_ll.table_len = (uchar *)0x0;
              tree_ll.table_value = (unsigned_short *)0x0;
              tree_d.codes = (uint *)0x0;
              tree_d.lengths = (uint *)0x0;
              tree_d.table_len = (uchar *)0x0;
              tree_d.table_value = (unsigned_short *)0x0;
              uVar13 = generateFixedLitLenTree(&tree_ll);
              if ((uVar13 == 0) && (uVar13 = generateFixedDistanceTree(&tree_d), uVar13 == 0)) {
                writeBits(&local_190,(uint)bVar39,1);
                writeBits(&local_190,1,1);
                writeBits(&local_190,0,1);
                if (settings->use_lz77 == 0) {
                  puVar18 = tree_ll.codes;
                  puVar28 = tree_ll.lengths;
                  if (uVar35 < uVar20) {
                    lVar27 = 0;
                    do {
                      writeBitsReversed(&local_190,puVar18[puVar17[lVar27]],
                                        (ulong)puVar28[puVar17[lVar27]]);
                      lVar27 = lVar27 + 1;
                    } while (uVar29 + lVar38 != lVar27);
                  }
                }
                else {
                  local_98._0_16_ = (undefined1  [16])0x0;
                  local_98._16_8_ = 0;
                  uVar13 = encodeLZ77((uivector *)local_98,&hash,in,uVar35,uVar20,
                                      settings->windowsize,settings->minmatch,settings->nicematch,
                                      settings->lazymatching);
                  if (uVar13 != 0) {
                    free((void *)local_98._0_8_);
                    goto LAB_001de4e2;
                  }
                  writeLZ77data(&local_190,(uivector *)local_98,&tree_ll,&tree_d);
                  free((void *)local_98._0_8_);
                  puVar28 = tree_ll.lengths;
                  puVar18 = tree_ll.codes;
                }
                writeBitsReversed(&local_190,puVar18[0x100],(ulong)puVar28[0x100]);
                uVar13 = 0;
              }
LAB_001de4e2:
              HuffmanTree_cleanup(&tree_ll);
              HuffmanTree_cleanup(&tree_d);
            }
          }
          uVar22 = uVar22 + 1;
          if (uVar22 == uVar36) break;
          uVar34 = uVar34 + sVar32;
          lVar38 = lVar38 - sVar32;
          puVar17 = puVar17 + sVar32;
        } while (uVar13 == 0);
      }
    }
    free(local_d8);
    free(local_e0);
    free(__ptr);
    free(local_d0);
    free(__s_00);
    free(local_e8);
  }
LAB_001def22:
  *out = v.data;
  *outsize = v.size;
  return uVar13;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGCompressSettings* settings) {
  ucvector v = ucvector_init(*out, *outsize);
  unsigned error = lodepng_deflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}